

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Result emulator_read_state_from_file(Emulator *e,char *filename)

{
  Result RVar1;
  Result RVar2;
  FileData file_data;
  FileData local_28;
  
  local_28.data = (u8 *)0x0;
  local_28.size = 0;
  RVar1 = file_read(filename,&local_28);
  RVar2 = ERROR;
  if (RVar1 == OK) {
    RVar2 = emulator_read_state(e,&local_28);
  }
  file_data_delete(&local_28);
  return RVar2;
}

Assistant:

Result emulator_read_state_from_file(Emulator* e, const char* filename) {
  Result result = ERROR;
  FileData file_data;
  ZERO_MEMORY(file_data);
  CHECK(SUCCESS(file_read(filename, &file_data)));
  CHECK(SUCCESS(emulator_read_state(e, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}